

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

longlong __thiscall
cmsys::SystemInformationImplementation::GetHostMemoryTotal(SystemInformationImplementation *this)

{
  int iVar1;
  longlong memTotal;
  ulong local_10;
  
  local_10 = 0;
  iVar1 = anon_unknown_3::GetFieldFromFile<long_long>
                    ("/proc/meminfo","MemTotal:",(longlong *)&local_10);
  return -(ulong)(iVar1 != 0) | local_10;
}

Assistant:

long long SystemInformationImplementation::GetHostMemoryTotal()
{
#if defined(_WIN32)
#  if defined(_MSC_VER) && _MSC_VER < 1300
  MEMORYSTATUS stat;
  stat.dwLength = sizeof(stat);
  GlobalMemoryStatus(&stat);
  return stat.dwTotalPhys / 1024;
#  else
  MEMORYSTATUSEX statex;
  statex.dwLength = sizeof(statex);
  GlobalMemoryStatusEx(&statex);
  return statex.ullTotalPhys / 1024;
#  endif
#elif defined(__linux) || defined(__CYGWIN__)
  long long memTotal = 0;
  int ierr = GetFieldFromFile("/proc/meminfo", "MemTotal:", memTotal);
  if (ierr) {
    return -1;
  }
  return memTotal;
#elif defined(__APPLE__)
  uint64_t mem;
  size_t len = sizeof(mem);
  int ierr = sysctlbyname("hw.memsize", &mem, &len, nullptr, 0);
  if (ierr) {
    return -1;
  }
  return mem / 1024;
#else
  return 0;
#endif
}